

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlGenericErrorFunc p_Var1;
  xmlXPathParserContextPtr ctxt_00;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlXPathObjectPtr local_30;
  xmlXPathObjectPtr res;
  xmlXPathParserContextPtr ctxt;
  xmlXPathContextPtr ctx_local;
  xmlChar *str_local;
  
  if (ctx == (xmlXPathContextPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0xc,1,XML_ERR_FATAL,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                    ,0x3885,(char *)0x0,(char *)0x0,(char *)0x0,0,0,"NULL context pointer\n");
    str_local = (xmlChar *)0x0;
  }
  else {
    xmlInitParser();
    ctxt_00 = xmlXPathNewParserContext(str,ctx);
    if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
      str_local = (xmlChar *)0x0;
    }
    else {
      xmlXPathEvalExpr(ctxt_00);
      if (ctxt_00->error == 0) {
        local_30 = valuePop(ctxt_00);
        if (local_30 == (xmlXPathObjectPtr)0x0) {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"xmlXPathCompiledEval: No result on the stack.\n");
        }
        else if (0 < ctxt_00->valueNr) {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                    (ulong)(uint)ctxt_00->valueNr);
        }
      }
      else {
        local_30 = (xmlXPathObjectPtr)0x0;
      }
      xmlXPathFreeParserContext(ctxt_00);
      str_local = (xmlChar *)local_30;
    }
  }
  return (xmlXPathObjectPtr)str_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res;

    CHECK_CTXT(ctx)

    xmlInitParser();

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
        return NULL;
    xmlXPathEvalExpr(ctxt);

    if (ctxt->error != XPATH_EXPRESSION_OK) {
	res = NULL;
    } else {
	res = valuePop(ctxt);
        if (res == NULL) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompiledEval: No result on the stack.\n");
        } else if (ctxt->valueNr > 0) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                ctxt->valueNr);
        }
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}